

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

TermList __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Applicator::
apply(Applicator *this,uint var)

{
  bool bVar1;
  TermList TVar2;
  uint in_ESI;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *in_RDI;
  uint nvar;
  TermList *cacheEntry;
  Renaming *in_stack_ffffffffffffffd0;
  TermList **in_stack_ffffffffffffffe0;
  
  bVar1 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
          getValuePtr(in_RDI,in_ESI,in_stack_ffffffffffffffe0);
  if (bVar1) {
    Kernel::Renaming::get(in_stack_ffffffffffffffd0,(uint)((ulong)in_RDI >> 0x20));
    TVar2 = Lib::ArrayMap<Kernel::TermList>::get((ArrayMap<Kernel::TermList> *)in_RDI,0x44442b);
    *in_stack_ffffffffffffffe0 = (TermList *)TVar2._content;
  }
  return (TermList)(uint64_t)*in_stack_ffffffffffffffe0;
}

Assistant:

TermList apply(unsigned var)
  {
    TermList* cacheEntry;
    if(_cache.getValuePtr(var,cacheEntry)) {
      ASS(_resultNormalizer->contains(var));
      unsigned nvar=_resultNormalizer->get(var);
      ASS(_parent->_bindings.find(nvar));
      *cacheEntry=_parent->_bindings.get(nvar);
    }
    return *cacheEntry;
  }